

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MethodBuilder.cpp
# Opt level: O2

InstructionNode * __thiscall
Lodtalk::MethodAssembler::Assembler::pushLiteral(Assembler *this,Oop literal)

{
  InstructionNode *pIVar1;
  size_t sVar2;
  
  if (literal.field_0 == (anon_union_8_4_0eb573b0_for_Oop_0)&NilObject) {
    pIVar1 = pushNil(this);
    return pIVar1;
  }
  if (literal.field_0 == (anon_union_8_4_0eb573b0_for_Oop_0)&TrueObject) {
    pIVar1 = pushTrue(this);
    return pIVar1;
  }
  if (literal.field_0 == (anon_union_8_4_0eb573b0_for_Oop_0)&FalseObject) {
    pIVar1 = pushFalse(this);
    return pIVar1;
  }
  if (literal.field_0 != (uint8_t *)0x1) {
    if (literal.field_0 == (uint8_t *)0x3) {
      pIVar1 = pushOne(this);
      return pIVar1;
    }
    sVar2 = addLiteral(this,literal);
    pIVar1 = pushLiteralIndex(this,(int)sVar2);
    return pIVar1;
  }
  pIVar1 = pushZero(this);
  return pIVar1;
}

Assistant:

InstructionNode *Assembler::pushLiteral(Oop literal)
{
    if(literal == nilOop())
        return pushNil();
    if(literal == trueOop())
        return pushTrue();
    if(literal == falseOop())
        return pushFalse();
    if(literal == Oop::encodeSmallInteger(1))
        return pushOne();
    if(literal == Oop::encodeSmallInteger(0))
        return pushZero();

	return pushLiteralIndex((int)addLiteral(literal));
}